

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

void __thiscall
Clasp::DefaultMinimize::reason(DefaultMinimize *this,Solver *s,Literal p,LitVec *lits)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  Literal x;
  Literal local_34;
  
  uVar2 = 0xffffffff;
  if (p.rep_ >> 2 < (s->assign_).reason_.data_.ebo_.size) {
    uVar2 = (s->assign_).reason_.data_.ebo_.buf[p.rep_ >> 2];
  }
  uVar1 = (s->shared_->step_).rep_;
  if ((3 < uVar1) &&
     ((byte)(*(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc)) & 3) ==
      (byte)(2U - ((uVar1 & 2) == 0)))) {
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(lits,&local_34);
  }
  if (0xf < *(uint *)((long)(s->assign_).assign_.ebo_.buf +
                     (ulong)((this->super_MinimizeConstraint).tag_.rep_ & 0xfffffffc))) {
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
              (lits,&(this->super_MinimizeConstraint).tag_);
  }
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(lits,&local_34)
      ;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

void DefaultMinimize::reason(Solver& s, Literal p, LitVec& lits) {
	assert(s.isTrue(tag_));
	uint32 stop = s.reasonData(p);
	Literal   x = s.sharedContext()->stepLiteral();
	assert(stop <= undoTop_);
	if (!isSentinel(x) && s.isTrue(x)) { lits.push_back(x); }
	if (s.level(tag_.var()))           { lits.push_back(tag_); }
	for (uint32 i = 0; i != stop; ++i) {
		UndoInfo u = undo_[i];
		x = shared_->lits[u.index()].first;
		lits.push_back(x);
	}
}